

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chain_vine_swap.h
# Opt level: O3

Index __thiscall
Gudhi::persistence_matrix::
Chain_vine_swap<Gudhi::persistence_matrix::Matrix<Chain_vine_options_with_row_access<(Gudhi::persistence_matrix::Column_types)7,_true,_false,_false,_true,_false,_false,_false>_>_>
::vine_swap(Chain_vine_swap<Gudhi::persistence_matrix::Matrix<Chain_vine_options_with_row_access<(Gudhi::persistence_matrix::Column_types)7,_true,_false,_false,_true,_false,_false,_false>_>_>
            *this,Index columnIndex1,Index columnIndex2)

{
  uint uVar1;
  undefined4 uVar2;
  _Invoker_type p_Var3;
  _Manager_type p_Var4;
  ID_index IVar5;
  Column_dimension_option CVar6;
  ID_index IVar7;
  bool bVar8;
  Index IVar9;
  _Invoker_type p_Var10;
  long lVar11;
  Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Chain_vine_options_with_row_access<(Gudhi::persistence_matrix::Column_types)7,_true,_false,_false,_true,_false,_false,_false>_>_>
  *pIVar12;
  ID_index pivot;
  uint uVar13;
  uint uVar14;
  long lVar15;
  Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Chain_vine_options_with_row_access<(Gudhi::persistence_matrix::Column_types)7,_true,_false,_false,_true,_false,_false,_false>_>_>
  *pIVar16;
  anon_class_1_0_00000001 local_3c;
  anon_class_1_0_00000001 local_3b;
  anon_class_1_0_00000001 local_3a;
  anon_class_1_0_00000001 local_39;
  anon_class_8_1_e4bd5e45 local_38;
  
  p_Var3 = this[1].deathComp_._M_invoker;
  lVar15 = (ulong)columnIndex1 * 0x40;
  p_Var10 = p_Var3 + lVar15 + 0x14;
  if ((ulong)*(uint *)(p_Var3 + lVar15 + 0x18) == 0xffffffff) {
    if ((ulong)*(uint *)(p_Var3 + (ulong)columnIndex2 * 0x40 + 0x18) == 0xffffffff) {
      uVar14 = *(uint *)p_Var10;
    }
    else {
      uVar14 = *(uint *)p_Var10;
      if (*(uint *)(p_Var3 + (ulong)*(uint *)(p_Var3 + (ulong)columnIndex2 * 0x40 + 0x18) * 0x40 +
                             0x14) < *(uint *)(p_Var3 + (ulong)columnIndex2 * 0x40 + 0x14)) {
LAB_001adbc2:
        lVar11 = (ulong)columnIndex2 * 0x40;
        p_Var10 = p_Var3 + lVar11 + 0x30;
        do {
          p_Var10 = *(_Invoker_type *)p_Var10;
          if (p_Var10 == p_Var3 + lVar11 + 0x30) {
            return columnIndex1;
          }
        } while (*(uint *)(p_Var10 + 0x10) != uVar14);
        pIVar12 = (Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Chain_vine_options_with_row_access<(Gudhi::persistence_matrix::Column_types)7,_true,_false,_false,_true,_false,_false,_false>_>_>
                   *)(p_Var3 + lVar11);
        uVar14 = *(uint *)(p_Var3 + lVar11 + 0x14);
        pIVar16 = (Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Chain_vine_options_with_row_access<(Gudhi::persistence_matrix::Column_types)7,_true,_false,_false,_true,_false,_false,_false>_>_>
                   *)(p_Var3 + lVar15);
        local_38.targetColumn = pIVar12;
        bVar8 = _generic_add_to_column<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Chain_vine_options_with_row_access<(Gudhi::persistence_matrix::Column_types)7,true,false,false,true,false,false,false>>>,Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Chain_vine_options_with_row_access<(Gudhi::persistence_matrix::Column_types)7,true,false,false,true,false,false,false>>>,Gudhi::persistence_matrix::_add_to_column<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Chain_vine_options_with_row_access<(Gudhi::persistence_matrix::Column_types)7,true,false,false,true,false,false,false>>>,Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Chain_vine_options_with_row_access<(Gudhi::persistence_matrix::Column_types)7,true,false,false,true,false,false,false>>>>(Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Chain_vine_options_with_row_access<___matrix::Column_types)7,true,false,false,true,false,false,false>>::Matrix_column_tag,1u>,false>___1_>
                          (pIVar16,pIVar12,&local_39,&local_38,&local_3a,&local_3b,&local_3c);
        if (bVar8) {
          CVar6.dim_ = (pIVar12->super_Column_dimension_option).dim_;
          IVar7 = (pIVar12->super_Chain_column_option).pivot_;
          IVar5 = (pIVar16->super_Chain_column_option).pivot_;
          pIVar12->super_Column_dimension_option =
               (Column_dimension_option)(pIVar16->super_Column_dimension_option).dim_;
          (pIVar12->super_Chain_column_option).pivot_ = IVar5;
          pIVar16->super_Column_dimension_option = (Column_dimension_option)CVar6.dim_;
          (pIVar16->super_Chain_column_option).pivot_ = IVar7;
        }
        uVar1 = (pIVar12->super_Chain_column_option).pivot_;
        if (uVar14 == uVar1) {
          return columnIndex1;
        }
        p_Var4 = this[2].birthComp_.super__Function_base._M_manager;
        uVar2 = *(undefined4 *)(p_Var4 + (ulong)uVar14 * 4);
        *(undefined4 *)(p_Var4 + (ulong)uVar14 * 4) = *(undefined4 *)(p_Var4 + (ulong)uVar1 * 4);
        *(undefined4 *)(p_Var4 + (ulong)uVar1 * 4) = uVar2;
        return columnIndex1;
      }
    }
LAB_001adc5c:
    p_Var10 = p_Var3 + (ulong)columnIndex2 * 0x40 + 0x30;
    while (p_Var10 = *(_Invoker_type *)p_Var10,
          p_Var10 != p_Var3 + (ulong)columnIndex2 * 0x40 + 0x30) {
      if (*(uint *)(p_Var10 + 0x10) == uVar14) {
        IVar9 = _positive_vine_swap(this,columnIndex1,columnIndex2);
        return IVar9;
      }
    }
  }
  else {
    uVar14 = *(uint *)p_Var10;
    uVar1 = *(uint *)(p_Var3 + (ulong)*(uint *)(p_Var3 + lVar15 + 0x18) * 0x40 + 0x14);
    lVar11 = (ulong)columnIndex2 * 0x40;
    if ((ulong)*(uint *)(p_Var3 + lVar11 + 0x18) == 0xffffffff) {
      uVar13 = uVar14;
      if (uVar14 <= uVar1) goto LAB_001adc5c;
    }
    else {
      uVar13 = *(uint *)p_Var10;
      if ((uVar1 < uVar14) &&
         (*(uint *)(p_Var3 + (ulong)*(uint *)(p_Var3 + lVar11 + 0x18) * 0x40 + 0x14) <
          *(uint *)(p_Var3 + lVar11 + 0x14))) {
        p_Var10 = p_Var3 + lVar11 + 0x30;
        do {
          p_Var10 = *(_Invoker_type *)p_Var10;
          if (p_Var10 == p_Var3 + lVar11 + 0x30) {
            return columnIndex1;
          }
        } while (*(uint *)(p_Var10 + 0x10) != uVar13);
        IVar9 = _negative_vine_swap(this,columnIndex1,columnIndex2);
        return IVar9;
      }
      if (uVar14 <= uVar1) {
        uVar14 = uVar13;
        if (*(uint *)(p_Var3 + (ulong)*(uint *)(p_Var3 + lVar11 + 0x18) * 0x40 + 0x14) <
            *(uint *)(p_Var3 + lVar11 + 0x14)) goto LAB_001adbc2;
        goto LAB_001adc5c;
      }
    }
    p_Var10 = p_Var3 + lVar11 + 0x30;
    do {
      p_Var10 = *(_Invoker_type *)p_Var10;
      if (p_Var10 == p_Var3 + lVar11 + 0x30) {
        return columnIndex1;
      }
    } while (*(uint *)(p_Var10 + 0x10) != uVar13);
    pIVar16 = (Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Chain_vine_options_with_row_access<(Gudhi::persistence_matrix::Column_types)7,_true,_false,_false,_true,_false,_false,_false>_>_>
               *)(p_Var3 + lVar15);
    pIVar12 = (Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Chain_vine_options_with_row_access<(Gudhi::persistence_matrix::Column_types)7,_true,_false,_false,_true,_false,_false,_false>_>_>
               *)(p_Var3 + lVar11);
    local_38.targetColumn = pIVar16;
    bVar8 = _generic_add_to_column<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Chain_vine_options_with_row_access<(Gudhi::persistence_matrix::Column_types)7,true,false,false,true,false,false,false>>>,Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Chain_vine_options_with_row_access<(Gudhi::persistence_matrix::Column_types)7,true,false,false,true,false,false,false>>>,Gudhi::persistence_matrix::_add_to_column<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Chain_vine_options_with_row_access<(Gudhi::persistence_matrix::Column_types)7,true,false,false,true,false,false,false>>>,Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Chain_vine_options_with_row_access<(Gudhi::persistence_matrix::Column_types)7,true,false,false,true,false,false,false>>>>(Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Chain_vine_options_with_row_access<___matrix::Column_types)7,true,false,false,true,false,false,false>>::Matrix_column_tag,1u>,false>___1_>
                      (pIVar12,pIVar16,&local_39,&local_38,&local_3a,&local_3b,&local_3c);
    if (bVar8) {
      CVar6.dim_ = (pIVar16->super_Column_dimension_option).dim_;
      IVar7 = (pIVar16->super_Chain_column_option).pivot_;
      IVar5 = (pIVar12->super_Chain_column_option).pivot_;
      pIVar16->super_Column_dimension_option =
           (Column_dimension_option)(pIVar12->super_Column_dimension_option).dim_;
      (pIVar16->super_Chain_column_option).pivot_ = IVar5;
      pIVar12->super_Column_dimension_option = (Column_dimension_option)CVar6.dim_;
      (pIVar12->super_Chain_column_option).pivot_ = IVar7;
    }
    uVar14 = (pIVar16->super_Chain_column_option).pivot_;
    columnIndex1 = columnIndex2;
    if (uVar13 != uVar14) {
      p_Var4 = this[2].birthComp_.super__Function_base._M_manager;
      uVar2 = *(undefined4 *)(p_Var4 + (ulong)uVar13 * 4);
      *(undefined4 *)(p_Var4 + (ulong)uVar13 * 4) = *(undefined4 *)(p_Var4 + (ulong)uVar14 * 4);
      *(undefined4 *)(p_Var4 + (ulong)uVar14 * 4) = uVar2;
    }
  }
  return columnIndex1;
}

Assistant:

inline typename Chain_vine_swap<Master_matrix>::Index Chain_vine_swap<Master_matrix>::vine_swap(Index columnIndex1,
                                                                                                Index columnIndex2)
{
  if constexpr (Master_matrix::Option_list::has_column_pairings) {
    GUDHI_CHECK(CP::are_adjacent(_matrix()->get_pivot(columnIndex1), _matrix()->get_pivot(columnIndex2)),
                std::invalid_argument(
                    "Chain_vine_swap::vine_swap - Columns to be swapped need to be adjacent in the 'real' matrix."));
  }

  const bool col1IsNeg = _is_negative_in_pair(columnIndex1);
  const bool col2IsNeg = _is_negative_in_pair(columnIndex2);

  if (col1IsNeg && col2IsNeg) {
    if (_matrix()->is_zero_entry(columnIndex2, _matrix()->get_pivot(columnIndex1))) {
      if constexpr (Master_matrix::Option_list::has_column_pairings) {
        ID_index pivot1 = _matrix()->get_pivot(columnIndex1);
        ID_index pivot2 = _matrix()->get_pivot(columnIndex2);

        CP::negative_transpose(pivot1, pivot2);
        CP::swap_positions(pivot1, pivot2);
      }
      return columnIndex1;
    }
    return _negative_vine_swap(columnIndex1, columnIndex2);
  }

  if (col1IsNeg) {
    if (_matrix()->is_zero_entry(columnIndex2, _matrix()->get_pivot(columnIndex1))) {
      if constexpr (Master_matrix::Option_list::has_column_pairings) {
        ID_index pivot1 = _matrix()->get_pivot(columnIndex1);
        ID_index pivot2 = _matrix()->get_pivot(columnIndex2);

        CP::negative_positive_transpose(pivot1, pivot2);
        CP::swap_positions(pivot1, pivot2);
      }
      return columnIndex1;
    }
    return _negative_positive_vine_swap(columnIndex1, columnIndex2);
  }

  if (col2IsNeg) {
    if (_matrix()->is_zero_entry(columnIndex2, _matrix()->get_pivot(columnIndex1))) {
      if constexpr (Master_matrix::Option_list::has_column_pairings) {
        ID_index pivot1 = _matrix()->get_pivot(columnIndex1);
        ID_index pivot2 = _matrix()->get_pivot(columnIndex2);

        CP::positive_negative_transpose(pivot1, pivot2);
        CP::swap_positions(pivot1, pivot2);
      }
      return columnIndex1;
    }
    return _positive_negative_vine_swap(columnIndex1, columnIndex2);
  }

  if (_matrix()->is_zero_entry(columnIndex2, _matrix()->get_pivot(columnIndex1))) {
    if constexpr (Master_matrix::Option_list::has_column_pairings) {
      ID_index pivot1 = _matrix()->get_pivot(columnIndex1);
      ID_index pivot2 = _matrix()->get_pivot(columnIndex2);

      CP::positive_transpose(pivot1, pivot2);
      CP::swap_positions(pivot1, pivot2);
    }
    return columnIndex1;
  }
  return _positive_vine_swap(columnIndex1, columnIndex2);
}